

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O3

Group * __thiscall r_exec::Group::get_secondary_group(Group *this)

{
  Code *pCVar1;
  short sVar2;
  undefined2 uVar3;
  long lVar4;
  Group *pGVar5;
  Group *pGVar6;
  pointer pcVar7;
  
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[0x13])();
  lVar4 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
          super_Code.markers.used_cells_head;
  if (lVar4 == -1) {
    pGVar6 = (Group *)0x0;
  }
  else {
    pcVar7 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
             super_Code.markers.cells.
             super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pGVar6 = (Group *)0x0;
    do {
      (**(code **)((long)((pcVar7[lVar4].data)->super__Object)._vptr__Object + 0x20))
                (pcVar7[lVar4].data,0);
      sVar2 = r_code::Atom::asOpcode();
      if (sVar2 == Opcodes::MkGrpPair) {
        pCVar1 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
                 super_Code.markers.cells.
                 super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar4].data;
        (**(code **)((long)(pCVar1->super__Object)._vptr__Object + 0x20))(pCVar1,1);
        r_code::Atom::asIndex();
        pGVar5 = (Group *)(**(code **)((long)(pCVar1->super__Object)._vptr__Object + 0x48))(pCVar1);
        if (pGVar5 == this) {
          pCVar1 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                   super_LObject.super_Code.markers.cells.
                   super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
                   ._M_impl.super__Vector_impl_data._M_start[lVar4].data;
          (**(code **)((long)(pCVar1->super__Object)._vptr__Object + 0x20))(pCVar1,2);
          uVar3 = r_code::Atom::asIndex();
          pGVar6 = (Group *)(**(code **)((long)(pCVar1->super__Object)._vptr__Object + 0x48))
                                      (pCVar1,uVar3);
          break;
        }
      }
      pcVar7 = (this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.
               super_Code.markers.cells.
               super__Vector_base<r_code::list<r_code::Code_*>::cell,_std::allocator<r_code::list<r_code::Code_*>::cell>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar4 = pcVar7[lVar4].next;
    } while (lVar4 != -1);
  }
  (*(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.super_LObject.super_Code.
    super__Object._vptr__Object[0x14])(this);
  return pGVar6;
}

Assistant:

Group *Group::get_secondary_group()
{
    Group *secondary = nullptr;
    r_code::list<Code *>::const_iterator m;
    acq_markers();

    for (m = markers.begin(); m != markers.end(); ++m) {
        if ((*m)->code(0).asOpcode() == Opcodes::MkGrpPair) {
            if ((Group *)(*m)->get_reference((*m)->code(GRP_PAIR_FIRST).asIndex()) == this) {
                secondary = (Group *)(*m)->get_reference((*m)->code(GRP_PAIR_SECOND).asIndex());
                break;
            }
        }
    }

    rel_markers();
    return secondary;
}